

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_descriptor.hpp
# Opt level: O3

size_t __thiscall
boost::asio::posix::stream_descriptor::read_some<boost::asio::mutable_buffers_1>
          (stream_descriptor *this,mutable_buffers_1 *buffers)

{
  int iVar1;
  size_t sVar2;
  error_code ec;
  error_code local_70;
  system_error local_60;
  
  local_70.m_val = 0;
  local_70.m_cat = system::system_category();
  local_60._0_8_ = (buffers->super_mutable_buffer).data_;
  local_60._8_8_ = (buffers->super_mutable_buffer).size_;
  local_60.m_error_code._0_8_ = local_60._8_8_;
  sVar2 = detail::descriptor_ops::sync_read
                    ((this->super_descriptor).
                     super_basic_io_object<boost::asio::detail::reactive_descriptor_service,_true>.
                     implementation_.descriptor_,
                     (this->super_descriptor).
                     super_basic_io_object<boost::asio::detail::reactive_descriptor_service,_true>.
                     implementation_.state_,(buf *)&local_60,1,local_60._8_8_ == 0,&local_70);
  local_60.m_error_code.m_cat = local_70.m_cat;
  iVar1 = local_70.m_val;
  if (local_70.m_val == 0) {
    return sVar2;
  }
  std::runtime_error::runtime_error(&local_60.super_runtime_error,"read_some");
  local_60._0_8_ = &PTR__system_error_00120cb0;
  local_60.m_error_code.m_val = iVar1;
  local_60.m_what._M_dataplus._M_p = (pointer)&local_60.m_what.field_2;
  local_60.m_what._M_string_length = 0;
  local_60.m_what.field_2._M_local_buf[0] = '\0';
  throw_exception<boost::system::system_error>(&local_60);
}

Assistant:

std::size_t read_some(const MutableBufferSequence& buffers)
  {
    boost::system::error_code ec;
    std::size_t s = this->get_service().read_some(
        this->get_implementation(), buffers, ec);
    boost::asio::detail::throw_error(ec, "read_some");
    return s;
  }